

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::releasePayload(Value *this)

{
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  byte bVar1;
  
  bVar1 = (byte)*(ushort *)&this->bits_;
  if (7 < bVar1) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x401,"void Json::Value::releasePayload()");
  }
  if ((0x2fU >> (bVar1 & 0x1f) & 1) == 0) {
    if ((0xc0U >> (bVar1 & 0x1f) & 1) != 0) {
      this_00 = &((this->value_).map_)->_M_t;
      if (this_00 !=
          (_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           *)0x0) {
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::~_Rb_tree(this_00);
      }
      operator_delete(this_00,0x30);
      return;
    }
    if ((*(ushort *)&this->bits_ >> 8 & 1) != 0) {
      free((this->value_).string_);
      return;
    }
  }
  return;
}

Assistant:

void Value::releasePayload() {
  switch (type()) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    break;
  case stringValue:
    if (isAllocated())
      releasePrefixedStringValue(value_.string_);
    break;
  case arrayValue:
  case objectValue:
    delete value_.map_;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
}